

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::FloatBilerpTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,FloatBilerpTexture *this)

{
  float *in_stack_fffffffffffffff0;
  
  StringPrintf<pbrt::TextureMapping2DHandle_const&,float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ FloatBilerpTexture mapping: %s v00: %f v01: %f v10: %f v11: %f ]",
             (char *)this,(TextureMapping2DHandle *)&this->v00,&this->v01,&this->v10,&this->v11,
             in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatBilerpTexture::ToString() const {
    return StringPrintf(
        "[ FloatBilerpTexture mapping: %s v00: %f v01: %f v10: %f v11: %f ]", mapping,
        v00, v01, v10, v11);
}